

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

void runN(Benchmark *b,int n,int siz)

{
  Benchmark *b_00;
  char *__s;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int siz_00;
  timespec *ptVar8;
  int nthread;
  ulong uVar9;
  bool bVar10;
  timespec tp;
  StringPiece SStack_148;
  RE2 RStack_138;
  ulong uStack_58;
  timespec local_28;
  
  ptVar8 = &local_28;
  bytes = 0;
  ns = 0;
  iVar2 = clock_gettime(0,&local_28);
  if (iVar2 < 0) {
    t0 = -1;
  }
  else {
    t0 = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
  }
  if (b->fn == (_func_void_int *)0x0) {
    if (b->fnr == (_func_void_int_int *)0x0) {
      runN();
      if (0 < nbenchmarks) {
        lVar6 = 0;
        uStack_58 = (ulong)(uint)n;
        do {
          b_00 = benchmarks[lVar6];
          if ((int)b == 1) {
LAB_0012b249:
            iVar2 = b_00->threadhi;
            if (b_00->threadlo <= iVar2) {
              iVar3 = b_00->hi;
              nthread = b_00->threadlo;
              do {
                siz_00 = b_00->lo;
                iVar7 = 1;
                if (1 < iVar3) {
                  iVar7 = iVar3;
                }
                if (siz_00 <= iVar7) {
                  if (siz_00 < 2) {
                    siz_00 = 1;
                  }
                  do {
                    RunBench(b_00,nthread,siz_00);
                    siz_00 = siz_00 * 2;
                    iVar3 = b_00->hi;
                    iVar2 = 1;
                    if (1 < iVar3) {
                      iVar2 = iVar3;
                    }
                  } while (siz_00 <= iVar2);
                  iVar2 = b_00->threadhi;
                }
                bVar10 = nthread < iVar2;
                nthread = nthread + 1;
              } while (bVar10);
            }
          }
          else if (1 < (int)b) {
            __s = b_00->name;
            bVar10 = true;
            uVar9 = 2;
            do {
              if (__s == (char *)0x0) {
                iVar2 = 0;
              }
              else {
                sVar4 = strlen(__s);
                iVar2 = (int)sVar4;
              }
              re2::RE2::RE2(&RStack_138,*(char **)((long)ptVar8 + uVar9 * 8 + -8));
              SStack_148.ptr_ = __s;
              SStack_148.length_ = iVar2;
              bVar1 = re2::RE2::PartialMatchN(&SStack_148,&RStack_138,(Arg **)0x0,0);
              re2::RE2::~RE2(&RStack_138);
              if (bVar1) break;
              bVar10 = uVar9 < ((ulong)b & 0xffffffff);
              lVar5 = (1 - ((ulong)b & 0xffffffff)) + uVar9;
              uVar9 = uVar9 + 1;
            } while (lVar5 != 1);
            if (bVar10) goto LAB_0012b249;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < nbenchmarks);
      }
      return;
    }
    (*b->fnr)(n,siz);
  }
  else {
    (*b->fn)(n);
  }
  if (t0 != 0) {
    iVar2 = clock_gettime(0,&local_28);
    if (iVar2 < 0) {
      local_28.tv_nsec = -1;
    }
    else {
      local_28.tv_nsec = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
    }
    ns = ns + (local_28.tv_nsec - t0);
  }
  return;
}

Assistant:

static void runN(Benchmark *b, int n, int siz) {
	bytes = 0;
	items = 0;
	ns = 0;
	t0 = nsec();
	if(b->fn)
		b->fn(n);
	else if(b->fnr)
		b->fnr(n, siz);
	else {
		fprintf(stderr, "%s: missing function\n", b->name);
		exit(2);
	}
	if(t0 != 0)
		ns += nsec() - t0;
}